

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

Vec_Ptr_t * Aig_ManDfs(Aig_Man_t *p,int fNodesOnly)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  Aig_Obj_t *pObj;
  int iVar2;
  
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  p_00 = Vec_PtrAlloc(p->vObjs->nSize);
  if (fNodesOnly == 0) {
    Vec_PtrPush(p_00,p->pConst1);
  }
  else {
    for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p->vCis,iVar2);
      *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
    }
  }
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar2);
    if (fNodesOnly != 0) {
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    }
    Aig_ManDfs_rec(p,pObj,p_00);
  }
  if (fNodesOnly == 0) {
    if (p_00->nSize != p->vObjs->nSize - p->nDeleted) {
      __assert_fail("Vec_PtrSize(vNodes) == Aig_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0xa6,"Vec_Ptr_t *Aig_ManDfs(Aig_Man_t *, int)");
    }
  }
  else if (p_00->nSize != p->nObjs[6] + p->nObjs[5]) {
    __assert_fail("Vec_PtrSize(vNodes) == Aig_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0xa4,"Vec_Ptr_t *Aig_ManDfs(Aig_Man_t *, int)");
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManDfs( Aig_Man_t * p, int fNodesOnly )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // mark PIs if they should not be collected
    if ( fNodesOnly )
        Aig_ManForEachCi( p, pObj, i )
            Aig_ObjSetTravIdCurrent( p, pObj );
    else
        Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfs_rec( p, fNodesOnly? Aig_ObjFanin0(pObj): pObj, vNodes );
    if ( fNodesOnly )
        assert( Vec_PtrSize(vNodes) == Aig_ManNodeNum(p) );
    else
        assert( Vec_PtrSize(vNodes) == Aig_ManObjNum(p) );
    return vNodes;
}